

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

char * GetOpName(SynBinaryOpType type)

{
  if (type - SYN_BINARY_OP_ADD < 0x15) {
    return &DAT_001da5d4 + *(int *)(&DAT_001da5d4 + (ulong)(type - SYN_BINARY_OP_ADD) * 4);
  }
  __assert_fail("!\"unknown operation type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0xece,"const char *GetOpName(SynBinaryOpType)");
}

Assistant:

const char* GetOpName(SynBinaryOpType type)
{
	switch(type)
	{
	case SYN_BINARY_OP_ADD:
		return "+";
	case SYN_BINARY_OP_SUB:
		return "-";
	case SYN_BINARY_OP_MUL:
		return "*";
	case SYN_BINARY_OP_DIV:
		return "/";
	case SYN_BINARY_OP_MOD:
		return "%";
	case SYN_BINARY_OP_POW:
		return "**";
	case SYN_BINARY_OP_SHL:
		return "<<";
	case SYN_BINARY_OP_SHR:
		return ">>";
	case SYN_BINARY_OP_LESS:
		return "<";
	case SYN_BINARY_OP_LESS_EQUAL:
		return "<=";
	case SYN_BINARY_OP_GREATER:
		return ">";
	case SYN_BINARY_OP_GREATER_EQUAL:
		return ">=";
	case SYN_BINARY_OP_EQUAL:
		return "==";
	case SYN_BINARY_OP_NOT_EQUAL:
		return "!=";
	case SYN_BINARY_OP_BIT_AND:
		return "&";
	case SYN_BINARY_OP_BIT_OR:
		return "|";
	case SYN_BINARY_OP_BIT_XOR:
		return "^";
	case SYN_BINARY_OP_LOGICAL_AND:
		return "&&";
	case SYN_BINARY_OP_LOGICAL_OR:
		return "||";
	case SYN_BINARY_OP_LOGICAL_XOR:
		return "^^";
	case SYN_BINARY_OP_IN:
		return "in";
	default:
		break;
	}

	assert(!"unknown operation type");
	return "";
}